

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task1-5.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  istream *piVar4;
  double *pdVar5;
  int local_68;
  int local_64;
  int w;
  int q;
  double t0;
  double v0;
  double x0;
  double w2;
  double q2;
  
  poVar3 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_717);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_73a);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,6);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_750);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,3);
  poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::ostream::_M_insert<double>(3.0);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::ostream::_M_insert<double>(3.14);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_75a);
  std::endl<char,std::char_traits<char>>(poVar3);
  piVar4 = (istream *)std::istream::operator>>((istream *)&std::cin,&q);
  pdVar5 = (double *)std::istream::operator>>(piVar4,&w);
  piVar4 = std::istream::_M_extract<double>(pdVar5);
  std::istream::_M_extract<double>((double *)piVar4);
  poVar3 = std::operator<<((ostream *)&std::cout,"int; int  ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,w + q);
  poVar3 = std::operator<<(poVar3,' ');
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,q - w);
  poVar3 = std::operator<<(poVar3,' ');
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,w * q);
  poVar3 = std::operator<<(poVar3,' ');
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,q / w);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::operator<<((ostream *)&std::cout,"double; double  ");
  poVar3 = std::ostream::_M_insert<double>(q2 + w2);
  std::operator<<(poVar3,' ');
  poVar3 = std::ostream::_M_insert<double>(q2 - w2);
  std::operator<<(poVar3,' ');
  poVar3 = std::ostream::_M_insert<double>(q2 * w2);
  std::operator<<(poVar3,' ');
  poVar3 = std::ostream::_M_insert<double>(q2 / w2);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::operator<<((ostream *)&std::cout,"int; double  ");
  poVar3 = std::ostream::_M_insert<double>((double)q + w2);
  std::operator<<(poVar3,' ');
  poVar3 = std::ostream::_M_insert<double>((double)q - w2);
  std::operator<<(poVar3,' ');
  poVar3 = std::ostream::_M_insert<double>((double)q * w2);
  std::operator<<(poVar3,' ');
  poVar3 = std::ostream::_M_insert<double>((double)q / w2);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::operator<<((ostream *)&std::cout,"double; int  ");
  poVar3 = std::ostream::_M_insert<double>((double)w + q2);
  std::operator<<(poVar3,' ');
  poVar3 = std::ostream::_M_insert<double>(q2 - (double)w);
  std::operator<<(poVar3,' ');
  poVar3 = std::ostream::_M_insert<double>((double)w * q2);
  std::operator<<(poVar3,' ');
  poVar3 = std::ostream::_M_insert<double>(q2 / (double)w);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_7b0);
  std::endl<char,std::char_traits<char>>(poVar3);
  piVar4 = (istream *)std::istream::operator>>((istream *)&std::cin,&local_64);
  std::istream::operator>>(piVar4,&local_68);
  local_68 = local_64;
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_64);
  poVar3 = std::operator<<(poVar3,' ');
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_68);
  std::endl<char,std::char_traits<char>>(poVar3);
  iVar2 = local_64;
  iVar1 = local_68;
  local_64 = local_68;
  local_68 = iVar2;
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  poVar3 = std::operator<<(poVar3,' ');
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_68);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_7c6);
  std::endl<char,std::char_traits<char>>(poVar3);
  piVar4 = std::istream::_M_extract<double>((double *)&std::cin);
  piVar4 = std::istream::_M_extract<double>((double *)piVar4);
  std::istream::_M_extract<double>((double *)piVar4);
  poVar3 = std::ostream::_M_insert<double>(t0 * -9.8 * t0 * 0.5 + v0 * t0 + x0);
  std::endl<char,std::char_traits<char>>(poVar3);
  return 0;
}

Assistant:

int
main (void)
{
    // первая задача
    cout << "Первая задача" << endl;
    cout << "Реезультат вычисления 2 + 2 * 2 = " << 2 + 2 * 2 << endl;

    // вторая задача
    cout << "Вторая задача" << endl;
    int a = 3, b = 3.999;

    double a2 = 3, b2 = 3.14;

    cout << a << endl << b << endl << a2 << endl << b2 << endl;

    // третья задача
    cout << "Третья задача" << endl;
    int q,w;
    double q2, w2;
    cin >> q >> w >> q2 >> w2;
    cout << "int; int  " << q + w << ' ' << q - w << ' ' << q*w << ' '  << q/w << endl;
    cout << "double; double  " << q2 + w2 << ' ' << q2 - w2 << ' ' << q2*w2 << ' ' << q2/w2 << endl;
    cout << "int; double  " << q + w2 << ' ' << q - w2 << ' ' << q*w2 << ' ' << q/w2 << endl;
    cout << "double; int  "<< q2 + w << ' ' << q2 - w << ' ' << q2*w << ' ' << q2/w << endl;

    // четвертая задача
    cout << "Четвертая задача" << endl;
    int z,x, temp;
    cin >> z >> x;
    x = z;
    z = x;

    cout << z << ' ' << x << endl;
    x = z -x;
    z = z -x;
    x = z + x;

    cout << z << ' ' << x << endl;

    // пятая задача
    cout << "Пятая задача" << endl;
    const double g = -9.8;
    double x0, v0, t0;
    cin >> x0 >> v0 >> t0;
    cout <<x0 + v0*t0 + g*t0*t0/2 << endl;

    return 0;
}